

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParseHelper.cpp
# Opt level: O0

void __thiscall
glslang::TParseContext::vkRelaxedRemapUniformMembers
          (TParseContext *this,TSourceLoc *loc,TPublicType *publicType,TType *type,
          TString *identifier)

{
  anon_class_24_3_980d5416 callback;
  uint uVar1;
  TString *identifier_local;
  TType *type_local;
  TPublicType *publicType_local;
  TSourceLoc *loc_local;
  TParseContext *this_local;
  
  uVar1 = (*type->_vptr_TType[0x25])();
  if (((uVar1 & 1) != 0) && (uVar1 = (*type->_vptr_TType[0x36])(), (uVar1 & 1) != 0)) {
    callback.loc = loc;
    callback.publicType = publicType;
    callback.this = this;
    ForEachOpaque<glslang::TParseContext::vkRelaxedRemapUniformMembers(glslang::TSourceLoc_const&,glslang::TPublicType_const&,glslang::TType_const&,std::__cxx11::basic_string<char,std::char_traits<char>,glslang::std::allocator<char>>const&)::__0>
              (type,identifier,callback);
  }
  return;
}

Assistant:

void TParseContext::vkRelaxedRemapUniformMembers(const TSourceLoc& loc, const TPublicType& publicType, const TType& type,
    const TString& identifier)
{
    if (!type.isStruct() || !type.containsOpaque())
        return;

    ForEachOpaque(type, identifier,
                  [&publicType, &loc, this](const TType& type, const TString& path) {
                      TArraySizes arraySizes = {};
                      if (type.getArraySizes()) arraySizes = *type.getArraySizes();
                      TTypeParameters typeParameters = {};
                      if (type.getTypeParameters()) typeParameters = *type.getTypeParameters();

                      TPublicType memberType{};
                      memberType.basicType = type.getBasicType();
                      memberType.sampler = type.getSampler();
                      memberType.qualifier = type.getQualifier();
                      memberType.vectorSize = type.getVectorSize();
                      memberType.matrixCols = type.getMatrixCols();
                      memberType.matrixRows = type.getMatrixRows();
                      memberType.coopmatNV = type.isCoopMatNV();
                      memberType.coopmatKHR = type.isCoopMatKHR();
                      memberType.arraySizes = nullptr;
                      memberType.userDef = nullptr;
                      memberType.loc = loc;
                      memberType.typeParameters = (type.getTypeParameters() ? &typeParameters : nullptr);
                      memberType.spirvType = nullptr;

                      memberType.qualifier.storage = publicType.qualifier.storage;
                      memberType.shaderQualifiers = publicType.shaderQualifiers;

                      TString& structMemberName = *NewPoolTString(path.c_str()); // A copy is required due to declareVariable() signature.
                      declareVariable(loc, structMemberName, memberType, nullptr, nullptr);
                  });
}